

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void add_array_ptr_member_fn(File *fp,OffsetEntry *oe,char *format,int last)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  if (fp->binary == 0) {
    if (*format == '&') {
      iVar4 = strcmp(oe->name,"NULL");
      format = format + (iVar4 == 0);
    }
    pcVar5 = "";
    if (last == 0) {
      pcVar5 = ",";
    }
    myfprintf(fp->fp,format,oe->name,pcVar5);
    return;
  }
  fp->n_elems = fp->n_elems + 1;
  make_room_in_buf(&fp->tables,(long)fp->elem_size);
  *(long *)(fp->tables).cur = (long)oe->offset;
  ppcVar2 = (fp->relocations).v;
  if (ppcVar2 == (char **)0x0) {
    pcVar5 = (fp->tables).cur;
    pcVar3 = (fp->tables).start;
    (fp->relocations).v = (fp->relocations).e;
    uVar1 = (fp->relocations).n;
    (fp->relocations).n = uVar1 + 1;
    (fp->relocations).e[uVar1] = pcVar5 + -(long)pcVar3;
    goto LAB_00138205;
  }
  uVar1 = (fp->relocations).n;
  if (ppcVar2 == (fp->relocations).e) {
    if (2 < uVar1) goto LAB_001381f1;
    pcVar5 = (fp->tables).cur + -(long)(fp->tables).start;
  }
  else {
    if ((uVar1 & 7) == 0) {
LAB_001381f1:
      vec_add_internal(&fp->relocations,(fp->tables).cur + -(long)(fp->tables).start);
      goto LAB_00138205;
    }
    pcVar5 = (fp->tables).cur + -(long)(fp->tables).start;
  }
  (fp->relocations).n = uVar1 + 1;
  ppcVar2[uVar1] = pcVar5;
LAB_00138205:
  ppcVar2 = &(fp->tables).cur;
  *ppcVar2 = *ppcVar2 + fp->elem_size;
  return;
}

Assistant:

static void add_array_ptr_member_fn(File *fp, OffsetEntry *oe, char *format, int last) {
  if (fp->binary) {
    add_array_member_internal(fp);
    *(void **)fp->tables.cur = (void *)(intptr_t)oe->offset;
    vec_add(&fp->relocations, (void *)(fp->tables.cur - fp->tables.start));
    fp->tables.cur += fp->elem_size;
  } else {
    if (*format == '&' && strcmp(oe->name, "NULL") == 0) format++;
    fprintf(fp->fp, format, oe->name, last ? "" : ",");
  }
}